

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

bool __thiscall
ON_BinaryArchive::ReadArray(ON_BinaryArchive *this,ON_SimpleArray<ON_DisplayMaterialRef> *a)

{
  bool bVar1;
  uint in_EAX;
  ON_DisplayMaterialRef *dmr;
  int iVar2;
  int count;
  undefined8 uStack_28;
  
  uStack_28._0_4_ = in_EAX;
  if (a->m_a != (ON_DisplayMaterialRef *)0x0) {
    memset(a->m_a,0,(long)a->m_capacity << 5);
  }
  a->m_count = 0;
  uStack_28 = (ulong)(uint)uStack_28;
  bVar1 = ReadInt(this,(ON__INT32 *)((long)&uStack_28 + 4));
  if (0 < (int)uStack_28._4_4_ && bVar1) {
    ON_SimpleArray<ON_DisplayMaterialRef>::SetCapacity(a,(ulong)uStack_28._4_4_);
    bVar1 = true;
    for (iVar2 = 0; (bVar1 != false && (iVar2 < (int)uStack_28._4_4_)); iVar2 = iVar2 + 1) {
      dmr = ON_SimpleArray<ON_DisplayMaterialRef>::AppendNew(a);
      bVar1 = ReadDisplayMaterialRef(this,dmr);
    }
  }
  return bVar1;
}

Assistant:

bool ON_BinaryArchive::ReadArray( ON_SimpleArray<ON_DisplayMaterialRef>& a )
{
  a.Empty();
  int count = 0;
  bool rc = ReadInt( &count );
  if ( rc && count > 0 ) 
  {
    a.SetCapacity( count );
    int i;
    for ( i = 0; i < count && rc; i++ )
    {
      rc = ReadDisplayMaterialRef(a.AppendNew());
    }
  }
  return rc;
}